

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

void __thiscall xercesc_4_0::CMStateSet::CMStateSet(CMStateSet *this,CMStateSet *toCopy)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong local_20;
  XMLSize_t index;
  CMStateSet *toCopy_local;
  CMStateSet *this_local;
  
  this->fBitCount = toCopy->fBitCount;
  this->fDynamicBuffer = (CMDynamicBuffer *)0x0;
  if (this->fBitCount < 0x81) {
    *(undefined8 *)this->fBits = *(undefined8 *)toCopy->fBits;
    *(undefined8 *)(this->fBits + 2) = *(undefined8 *)(toCopy->fBits + 2);
  }
  else {
    pMVar1 = toCopy->fDynamicBuffer->fMemoryManager;
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x18);
    this->fDynamicBuffer = (CMDynamicBuffer *)CONCAT44(extraout_var,iVar2);
    this->fDynamicBuffer->fMemoryManager = toCopy->fDynamicBuffer->fMemoryManager;
    this->fDynamicBuffer->fArraySize = this->fBitCount >> 10;
    if ((this->fBitCount & 0x3ff) != 0) {
      this->fDynamicBuffer->fArraySize = this->fDynamicBuffer->fArraySize + 1;
    }
    pMVar1 = this->fDynamicBuffer->fMemoryManager;
    iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,this->fDynamicBuffer->fArraySize << 3);
    this->fDynamicBuffer->fBitArray = (XMLInt32 **)CONCAT44(extraout_var_00,iVar2);
    for (local_20 = 0; local_20 < this->fDynamicBuffer->fArraySize; local_20 = local_20 + 1) {
      if (toCopy->fDynamicBuffer->fBitArray[local_20] == (XMLInt32 *)0x0) {
        this->fDynamicBuffer->fBitArray[local_20] = (XMLInt32 *)0x0;
      }
      else {
        allocateChunk(this,local_20);
        memcpy(this->fDynamicBuffer->fBitArray[local_20],toCopy->fDynamicBuffer->fBitArray[local_20]
               ,0x80);
      }
    }
  }
  return;
}

Assistant:

CMStateSet(const CMStateSet& toCopy) :
        XMemory(toCopy)
      , fBitCount(toCopy.fBitCount)
      , fDynamicBuffer(0)
    {
        //
        //  See if we need to allocate the byte array or whether we can live
        //  within the cahced bit high performance scheme.
        //
        if (fBitCount > (CMSTATE_CACHED_INT32_SIZE * 32))
        {
            fDynamicBuffer = (CMDynamicBuffer*) toCopy.fDynamicBuffer->fMemoryManager->allocate(sizeof(CMDynamicBuffer));
            fDynamicBuffer->fMemoryManager = toCopy.fDynamicBuffer->fMemoryManager;
            fDynamicBuffer->fArraySize = fBitCount / CMSTATE_BITFIELD_CHUNK;
            if (fBitCount % CMSTATE_BITFIELD_CHUNK)
                fDynamicBuffer->fArraySize++;
            fDynamicBuffer->fBitArray = (XMLInt32**) fDynamicBuffer->fMemoryManager->allocate(fDynamicBuffer->fArraySize*sizeof(XMLInt32*));
            for(XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                if(toCopy.fDynamicBuffer->fBitArray[index]!=NULL)
                {
                    allocateChunk(index);
                    memcpy((void *) fDynamicBuffer->fBitArray[index],
                           (const void *) toCopy.fDynamicBuffer->fBitArray[index],
                           CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                }
                else
                    fDynamicBuffer->fBitArray[index]=NULL;
            }
        }
        else
        {
            memcpy((void *) fBits,
                   (const void *) toCopy.fBits,
                   CMSTATE_CACHED_INT32_SIZE * sizeof(XMLInt32));
        }
    }